

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::limit_gradation_once_tmpl<2,2>(Omega_h *this,Mesh *mesh,Reals *values,Real max_rate)

{
  LO LVar1;
  void *extraout_RDX;
  Reals RVar2;
  Read<double> local_140;
  undefined1 local_130 [48];
  undefined1 local_100 [8];
  type f;
  string local_a0 [32];
  undefined1 local_80 [8];
  Write<double> out;
  undefined1 local_60 [8];
  Reals coords;
  Graph v2v;
  Real max_rate_local;
  Reals *values_local;
  Mesh *mesh_local;
  
  Mesh::ask_star((Graph *)&coords.write_.shared_alloc_.direct_ptr,mesh,0);
  Mesh::coords((Mesh *)local_60);
  LVar1 = Mesh::nverts(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7))
  ;
  Write<double>::Write((Write<double> *)local_80,LVar1 * 3,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  Read<double>::Read((Read<double> *)local_100,values);
  Read<double>::Read((Read<double> *)&f.values.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_60);
  Graph::Graph((Graph *)&f.coords.write_.shared_alloc_.direct_ptr,
               (Graph *)&coords.write_.shared_alloc_.direct_ptr);
  f.v2v.ab2b.write_.shared_alloc_.direct_ptr = (void *)max_rate;
  Write<double>::Write((Write<double> *)&f.max_rate,(Write<double> *)local_80);
  LVar1 = Mesh::nverts(mesh);
  parallel_for<Omega_h::limit_gradation_once_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<double>,double)::_lambda(int)_1_>
            (LVar1,(type *)local_100,"limit_metric_gradation");
  Write<double>::Write((Write<double> *)(local_130 + 0x10),(Write<double> *)local_80);
  Read<double>::Read((Read<double> *)(local_130 + 0x20),(Write<double> *)(local_130 + 0x10));
  Read<double>::operator=(values,(Read<double> *)(local_130 + 0x20));
  Read<double>::~Read((Read<double> *)(local_130 + 0x20));
  Write<double>::~Write((Write<double> *)(local_130 + 0x10));
  Read<double>::Read(&local_140,values);
  Mesh::sync_array<double>((Mesh *)local_130,(Int)mesh,(Read<double> *)0x0,(Int)&local_140);
  Read<double>::operator=(values,(Read<double> *)local_130);
  Read<double>::~Read((Read<double> *)local_130);
  Read<double>::~Read(&local_140);
  Read<double>::Read((Read<double> *)this,(Read<signed_char> *)values);
  limit_gradation_once_tmpl<2,2>(Omega_h::Mesh*,Omega_h::Read<double>,double)::{lambda(int)#1}::
  ~Mesh((_lambda_int__1_ *)local_100);
  Write<double>::~Write((Write<double> *)local_80);
  Read<double>::~Read((Read<double> *)local_60);
  Graph::~Graph((Graph *)&coords.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals limit_gradation_once_tmpl(
    Mesh* mesh, Reals values, Real max_rate) {
  auto v2v = mesh->ask_star(VERT);
  auto coords = mesh->coords();
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(metric_dim));
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto m = get_symm<metric_dim>(values, v);
    auto x = get_vector<mesh_dim>(coords, v);
    for (auto vv = v2v.a2ab[v]; vv < v2v.a2ab[v + 1]; ++vv) {
      auto av = v2v.ab2b[vv];
      auto am = get_symm<metric_dim>(values, av);
      auto ax = get_vector<mesh_dim>(coords, av);
      auto vec = ax - x;
      auto metric_dist = metric_length(am, vec);
      auto factor = metric_eigenvalue_from_length(1.0 + metric_dist * max_rate);
      auto limiter = am * factor;
      auto limited = intersect_metrics(m, limiter);
      m = limited;
    }
    set_symm(out, v, m);
  };
  parallel_for(mesh->nverts(), f, "limit_metric_gradation");
  values = Reals(out);
  values = mesh->sync_array(VERT, values, symm_ncomps(metric_dim));
  return values;
}